

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxPortFactory.cpp
# Opt level: O0

string * __thiscall
LinuxPortFactory::next_abi_cxx11_(string *__return_storage_ptr__,LinuxPortFactory *this)

{
  int iVar1;
  char *pcVar2;
  allocator<char> local_36;
  allocator<char> local_35 [20];
  allocator<char> local_21;
  dirent *local_20;
  dirent *entry;
  LinuxPortFactory *this_local;
  
  entry = (dirent *)this;
  this_local = (LinuxPortFactory *)__return_storage_ptr__;
  if (this->_dir == (DIR *)0x0) {
    (*(this->super_PortFactoryBase)._vptr_PortFactoryBase[3])(__return_storage_ptr__);
  }
  else {
    do {
      local_20 = readdir((DIR *)this->_dir);
      if (local_20 == (dirent *)0x0) {
        (*(this->super_PortFactoryBase)._vptr_PortFactoryBase[3])(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      iVar1 = strncmp("ttyUSB",local_20->d_name,6);
      if (iVar1 == 0) {
        pcVar2 = local_20->d_name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,pcVar2,&local_21);
        std::allocator<char>::~allocator(&local_21);
        return __return_storage_ptr__;
      }
      iVar1 = strncmp("ttyACM",local_20->d_name,6);
      if (iVar1 == 0) {
        pcVar2 = local_20->d_name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,pcVar2,local_35);
        std::allocator<char>::~allocator(local_35);
        return __return_storage_ptr__;
      }
      iVar1 = strncmp("ttyS",local_20->d_name,4);
    } while (iVar1 != 0);
    pcVar2 = local_20->d_name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar2,&local_36);
    std::allocator<char>::~allocator(&local_36);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
LinuxPortFactory::next()
{
    struct dirent* entry;

    if (!_dir)
        return end();

    while ((entry = readdir(_dir)))
    {
        if (strncmp("ttyUSB", entry->d_name, sizeof("ttyUSB") - 1) == 0)
            return std::string(entry->d_name);
        else if (strncmp("ttyACM", entry->d_name, sizeof("ttyACM") - 1) == 0)
            return std::string(entry->d_name);
        else if (strncmp("ttyS", entry->d_name, sizeof("ttyS") - 1) == 0)
            return std::string(entry->d_name);
    }

    return end();
}